

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int gmatch(lua_State *L)

{
  char *pcVar1;
  char *pcVar2;
  lua_Integer lVar3;
  undefined8 *puVar4;
  ulong uVar5;
  long lVar6;
  size_t ls;
  size_t lp;
  ulong local_30;
  size_t local_28;
  
  pcVar1 = luaL_checklstring(L,1,&local_30);
  pcVar2 = luaL_checklstring(L,2,&local_28);
  lVar3 = luaL_optinteger(L,3,1);
  lVar6 = lVar3;
  if (lVar3 < 1) {
    lVar6 = 1;
    if (SBORROW8(lVar3,-local_30) == (long)(lVar3 + local_30) < 0 && lVar3 != 0) {
      lVar6 = lVar3 + 1 + local_30;
    }
  }
  lua_settop(L,2);
  puVar4 = (undefined8 *)lua_newuserdata(L,0x240);
  puVar4[6] = L;
  *(undefined4 *)(puVar4 + 7) = 200;
  puVar4[3] = pcVar1;
  uVar5 = local_30 + 1;
  if (lVar6 - 1U <= local_30) {
    uVar5 = lVar6 - 1U;
  }
  puVar4[4] = pcVar1 + local_30;
  puVar4[5] = pcVar2 + local_28;
  *puVar4 = pcVar1 + uVar5;
  puVar4[1] = pcVar2;
  puVar4[2] = 0;
  lua_pushcclosure(L,gmatch_aux,3);
  return 1;
}

Assistant:

static int gmatch (lua_State *L) {
  size_t ls, lp;
  const char *s = luaL_checklstring(L, 1, &ls);
  const char *p = luaL_checklstring(L, 2, &lp);
  size_t init = posrelatI(luaL_optinteger(L, 3, 1), ls) - 1;
  GMatchState *gm;
  lua_settop(L, 2);  /* keep strings on closure to avoid being collected */
  gm = (GMatchState *)lua_newuserdata(L, sizeof(GMatchState));
  if (init > ls)  /* start after string's end? */
    init = ls + 1;  /* avoid overflows in 's + init' */
  prepstate(&gm->ms, L, s, ls, p, lp);
  gm->src = s + init; gm->p = p; gm->lastmatch = NULL;
  lua_pushcclosure(L, gmatch_aux, 3);
  return 1;
}